

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sysconfig_files.c
# Opt level: O0

ares_status_t
ares_sysconfig_parse_resolv_line
          (ares_channel_t *channel,ares_sysconfig_t *sysconfig,ares_buf_t *line)

{
  ares_bool_t aVar1;
  ares_status_t aVar2;
  size_t sVar3;
  ares_status_t local_24c;
  char local_248 [4];
  ares_status_t status;
  char value [512];
  char option [32];
  ares_buf_t *line_local;
  ares_sysconfig_t *sysconfig_local;
  ares_channel_t *channel_local;
  
  aVar1 = ares_buf_begins_with(line,"#",1);
  if ((aVar1 == ARES_FALSE) && (aVar1 = ares_buf_begins_with(line,";",1), aVar1 == ARES_FALSE)) {
    ares_buf_tag(line);
    sVar3 = ares_buf_consume_nonwhitespace(line);
    if (sVar3 == 0) {
      channel_local._4_4_ = ARES_SUCCESS;
    }
    else {
      aVar2 = ares_buf_tag_fetch_string(line,value + 0x1f8,0x20);
      if (aVar2 == ARES_SUCCESS) {
        ares_buf_consume_whitespace(line,ARES_TRUE);
        aVar2 = buf_fetch_string(line,local_248,0x200);
        if (aVar2 == ARES_SUCCESS) {
          ares_str_trim(local_248);
          if (local_248[0] == '\0') {
            channel_local._4_4_ = ARES_SUCCESS;
          }
          else {
            aVar1 = ares_streq(value + 0x1f8,"domain");
            if (aVar1 == ARES_FALSE) {
              aVar1 = ares_streq(value + 0x1f8,"lookup");
              if ((aVar1 == ARES_FALSE) &&
                 (aVar1 = ares_streq(value + 0x1f8,"hostresorder"), aVar1 == ARES_FALSE)) {
                aVar1 = ares_streq(value + 0x1f8,"search");
                if (aVar1 == ARES_FALSE) {
                  aVar1 = ares_streq(value + 0x1f8,"nameserver");
                  if (aVar1 == ARES_FALSE) {
                    aVar1 = ares_streq(value + 0x1f8,"sortlist");
                    if (aVar1 == ARES_FALSE) {
                      aVar1 = ares_streq(value + 0x1f8,"options");
                      local_24c = ARES_SUCCESS;
                      if (aVar1 != ARES_FALSE) {
                        local_24c = ares_sysconfig_set_options(sysconfig,local_248);
                      }
                    }
                    else {
                      local_24c = ares_parse_sortlist(&sysconfig->sortlist,&sysconfig->nsortlist,
                                                      local_248);
                      if (local_24c != ARES_ENOMEM) {
                        local_24c = ARES_SUCCESS;
                      }
                    }
                  }
                  else {
                    local_24c = ares_sconfig_append_fromstr
                                          (channel,&sysconfig->sconfig,local_248,ARES_TRUE);
                  }
                }
                else {
                  local_24c = config_search(sysconfig,local_248,0);
                }
              }
              else {
                ares_buf_tag_rollback(line);
                local_24c = config_lookup(sysconfig,line," \t");
              }
            }
            else {
              local_24c = ARES_SUCCESS;
              if (sysconfig->domains == (char **)0x0) {
                local_24c = config_search(sysconfig,local_248,1);
              }
            }
            channel_local._4_4_ = local_24c;
          }
        }
        else {
          channel_local._4_4_ = ARES_SUCCESS;
        }
      }
      else {
        channel_local._4_4_ = ARES_SUCCESS;
      }
    }
  }
  else {
    channel_local._4_4_ = ARES_SUCCESS;
  }
  return channel_local._4_4_;
}

Assistant:

ares_status_t ares_sysconfig_parse_resolv_line(const ares_channel_t *channel,
                                               ares_sysconfig_t     *sysconfig,
                                               ares_buf_t           *line)
{
  char          option[32];
  char          value[512];
  ares_status_t status = ARES_SUCCESS;

  /* Ignore lines beginning with a comment */
  if (ares_buf_begins_with(line, (const unsigned char *)"#", 1) ||
      ares_buf_begins_with(line, (const unsigned char *)";", 1)) {
    return ARES_SUCCESS;
  }

  ares_buf_tag(line);

  /* Shouldn't be possible, but if it happens, ignore the line. */
  if (ares_buf_consume_nonwhitespace(line) == 0) {
    return ARES_SUCCESS;
  }

  status = ares_buf_tag_fetch_string(line, option, sizeof(option));
  if (status != ARES_SUCCESS) {
    return ARES_SUCCESS;
  }

  ares_buf_consume_whitespace(line, ARES_TRUE);

  status = buf_fetch_string(line, value, sizeof(value));
  if (status != ARES_SUCCESS) {
    return ARES_SUCCESS;
  }

  ares_str_trim(value);
  if (*value == 0) {
    return ARES_SUCCESS;
  }

  /* At this point we have a string option and a string value, both trimmed
   * of leading and trailing whitespace.  Lets try to evaluate them */
  if (ares_streq(option, "domain")) {
    /* Domain is legacy, don't overwrite an existing config set by search */
    if (sysconfig->domains == NULL) {
      status = config_search(sysconfig, value, 1);
    }
  } else if (ares_streq(option, "lookup") ||
             ares_streq(option, "hostresorder")) {
    ares_buf_tag_rollback(line);
    status = config_lookup(sysconfig, line, " \t");
  } else if (ares_streq(option, "search")) {
    status = config_search(sysconfig, value, 0);
  } else if (ares_streq(option, "nameserver")) {
    status = ares_sconfig_append_fromstr(channel, &sysconfig->sconfig, value,
                                         ARES_TRUE);
  } else if (ares_streq(option, "sortlist")) {
    /* Ignore all failures except ENOMEM.  If the sysadmin set a bad
     * sortlist, just ignore the sortlist, don't cause an inoperable
     * channel */
    status =
      ares_parse_sortlist(&sysconfig->sortlist, &sysconfig->nsortlist, value);
    if (status != ARES_ENOMEM) {
      status = ARES_SUCCESS;
    }
  } else if (ares_streq(option, "options")) {
    status = ares_sysconfig_set_options(sysconfig, value);
  }

  return status;
}